

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall
LoopCrosser::CellCrossesCell(LoopCrosser *this,S2ClippedShape *a_clipped,S2ClippedShape *b_clipped)

{
  bool bVar1;
  int iVar2;
  int aj;
  int local_30;
  int i;
  int a_num_edges;
  S2ClippedShape *b_clipped_local;
  S2ClippedShape *a_clipped_local;
  LoopCrosser *this_local;
  
  iVar2 = S2ClippedShape::num_edges(a_clipped);
  local_30 = 0;
  while( true ) {
    if (iVar2 <= local_30) {
      return false;
    }
    aj = S2ClippedShape::edge(a_clipped,local_30);
    StartEdge(this,aj);
    bVar1 = EdgeCrossesCell(this,b_clipped);
    if (bVar1) break;
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool LoopCrosser::CellCrossesCell(const S2ClippedShape& a_clipped,
                                  const S2ClippedShape& b_clipped) {
  // Test all edges of "a_clipped" against all edges of "b_clipped".
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    StartEdge(a_clipped.edge(i));
    if (EdgeCrossesCell(b_clipped)) return true;
  }
  return false;
}